

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldTypes.h
# Opt level: O2

int __thiscall FIX::DateTime::getWeekDay(DateTime *this)

{
  int iVar1;
  int iVar2;
  int D;
  int M;
  int Y;
  
  getYMD(this,&Y,&M,&D);
  iVar2 = M + 10;
  if (2 < M) {
    iVar2 = M + -2;
  }
  iVar1 = Y - (uint)(M < 3);
  iVar2 = ((int)((long)iVar1 % 100) + D + iVar1 / 400 + (iVar1 / -100) * 2 +
           (int)((double)iVar2 * 2.6 + -0.2) + (int)(char)((char)((long)iVar1 % 100) / '\x04')) % 7;
  iVar1 = iVar2 + 7;
  if (-1 < iVar2) {
    iVar1 = iVar2;
  }
  return iVar1 + 1;
}

Assistant:

inline int getWeekDay() const {
    int Y, M, D;
    getYMD(Y, M, D);
    int m = M >= 3 ? M - 2 : M + 10;
    int Yprime = M >= 3 ? Y : Y - 1;
    int y = Yprime % 100;
    int c = Yprime / 100;
    int wd = (D + int(2.6 * m - 0.2) + y + int(y / 4) + int(c / 4) - (2 * c)) % 7;
    return 1 + (wd < 0 ? 7 + wd : wd);
  }